

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QSize __thiscall QMainWindowLayout::sizeHint(QMainWindowLayout *this)

{
  QSize QVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  if ((*(int *)(this + 0x77c) < 0) || (*(int *)(this + 0x780) < 0)) {
    QVar1 = QMainWindowLayoutState::sizeHint((QMainWindowLayoutState *)(this + 0x88));
    *(QSize *)(this + 0x77c) = QVar1;
    if (*(long **)(this + 0x708) == (long *)0x0) {
      uVar2 = 0;
      iVar3 = 0;
    }
    else {
      uVar2 = (**(code **)(**(long **)(this + 0x708) + 0x10))();
      iVar3 = (int)(uVar2 >> 0x20);
    }
    uVar4 = (ulong)*(uint *)(this + 0x77c);
    if ((int)*(uint *)(this + 0x77c) < (int)uVar2) {
      uVar4 = uVar2 & 0xffffffff;
    }
    *(ulong *)(this + 0x77c) = uVar4 | (ulong)(uint)(iVar3 + *(int *)(this + 0x780)) << 0x20;
  }
  return *(QSize *)(this + 0x77c);
}

Assistant:

QSize QMainWindowLayout::sizeHint() const
{
    if (!szHint.isValid()) {
        szHint = layoutState.sizeHint();
        const QSize sbHint = statusbar ? statusbar->sizeHint() : QSize(0, 0);
        szHint = QSize(qMax(sbHint.width(), szHint.width()),
                        sbHint.height() + szHint.height());
    }
    return szHint;
}